

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O3

void zzRedMont_fast(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  int iVar1;
  word wVar2;
  size_t n_00;
  word *b;
  word wVar3;
  
  if (n == 0) {
    wVar3 = 0;
  }
  else {
    wVar3 = 0;
    n_00 = n;
    b = a;
    do {
      wVar2 = zzAddMulW(b,mod,n,*b * mont_param);
      wVar2 = zzAddW2(b + n,n_00,wVar2);
      wVar3 = wVar3 | wVar2;
      b = b + 1;
      n_00 = n_00 - 1;
    } while (n_00 != 0);
  }
  wwCopy(a,a + n,n);
  a[n] = wVar3;
  iVar1 = wwCmp2(a,n + 1,mod,n);
  if (iVar1 < 0) {
    return;
  }
  zzSub2(a,mod,n);
  return;
}

Assistant:

void FAST(zzRedMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0 && mod[0] % 2);
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция в редакции Дуссе -- Калиски
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		carry |= zzAddW2(a + i + n, n - i, zzAddMulW(a + i, mod, n, w));
	}
	ASSERT(wwIsZero(a, n));
	// a <- a / B^n
	wwCopy(a, a + n, n);
	a[n] = carry;
	// a >= mod?
	if (wwCmp2(a, n + 1, mod, n) >= 0)
		// a <- a - mod
		zzSub2(a, mod, n);
	// очистка
	carry = w = 0;
}